

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomNumberGenerator.cc
# Opt level: O0

double __thiscall OpenMesh::RandomNumberGenerator::getRand(RandomNumberGenerator *this)

{
  int iVar1;
  uint local_1c;
  double dStack_18;
  uint i;
  double randNum;
  RandomNumberGenerator *this_local;
  
  dStack_18 = 0.0;
  for (local_1c = 0; (ulong)local_1c < this->iterations_; local_1c = local_1c + 1) {
    iVar1 = rand();
    dStack_18 = (double)iVar1 + dStack_18 * 2147483648.0;
  }
  return dStack_18 / this->maxNum_;
}

Assistant:

double RandomNumberGenerator::getRand() const {
  double randNum = 0.0;
  for ( unsigned int i = 0 ; i < iterations_; ++i ) {
    randNum *= (RAND_MAX + 1.0);
    randNum += rand();
  }

  return randNum / maxNum_;
}